

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UniformField.cpp
# Opt level: O1

void __thiscall OpenMD::UniformField::initialize(UniformField *this)

{
  pointer pdVar1;
  pointer pdVar2;
  pointer pdVar3;
  pointer pdVar4;
  double *pdVar5;
  vector<double,_std::allocator<double>_> local_48;
  
  if ((this->simParams->ElectricField).super_ParameterBase.empty_ == false) {
    this->doUniformField = true;
    std::vector<double,_std::allocator<double>_>::vector
              (&local_48,&(this->simParams->ElectricField).data_);
    pdVar3 = local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    pdVar4 = local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pdVar5 = local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
  }
  else {
    pdVar3 = (pointer)0x0;
    pdVar4 = (pointer)0x0;
    pdVar5 = (double *)0x0;
  }
  if ((this->simParams->UniformField).super_ParameterBase.empty_ == false) {
    this->doUniformField = true;
    std::vector<double,_std::allocator<double>_>::vector
              (&local_48,&(this->simParams->UniformField).data_);
    pdVar2 = local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage;
    pdVar4 = local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_finish;
    pdVar1 = local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
             super__Vector_impl_data._M_start;
    local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (double *)0x0;
    local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    if (pdVar5 != (double *)0x0) {
      operator_delete(pdVar5,(long)pdVar3 - (long)pdVar5);
    }
    pdVar5 = pdVar1;
    pdVar3 = pdVar2;
    if (local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start != (double *)0x0) {
      operator_delete(local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
  }
  if ((long)pdVar4 - (long)pdVar5 != 0x18) {
    snprintf(painCave.errMsg,2000,
             "UniformField: Incorrect number of parameters specified.\n\tthere should be 3 parameters, but %zu were specified.\n"
             ,(long)pdVar4 - (long)pdVar5 >> 3);
    painCave.isFatal = 1;
    simError();
  }
  (this->EF).super_Vector<double,_3U>.data_[0] = *pdVar5;
  (this->EF).super_Vector<double,_3U>.data_[1] = pdVar5[1];
  (this->EF).super_Vector<double,_3U>.data_[2] = pdVar5[2];
  if ((((this->super_ForceModifier).info_)->sman_->atomStorageLayout_ & 0x40) != 0) {
    this->doParticlePot = true;
  }
  this->initialized = true;
  operator_delete(pdVar5,(long)pdVar3 - (long)pdVar5);
  return;
}

Assistant:

void UniformField::initialize() {
    std::vector<RealType> ef;

    if (simParams->haveElectricField()) {
      doUniformField = true;
      ef             = simParams->getElectricField();
    }
    if (simParams->haveUniformField()) {
      doUniformField = true;
      ef             = simParams->getUniformField();
    }
    if (ef.size() != 3) {
      snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
               "UniformField: Incorrect number of parameters specified.\n"
               "\tthere should be 3 parameters, but %zu were specified.\n",
               ef.size());
      painCave.isFatal = 1;
      simError();
    }
    EF.x() = ef[0];
    EF.y() = ef[1];
    EF.z() = ef[2];

    int storageLayout_ = info_->getSnapshotManager()->getAtomStorageLayout();
    if (storageLayout_ & DataStorage::dslParticlePot) doParticlePot = true;
    initialized = true;
  }